

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QSizePolicy *policy)

{
  long lVar1;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 data;
  quint32 *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_RSI,in_stack_ffffffffffffffd8);
  *(uint *)in_RSI = *(uint *)in_RSI & 0xfff0ffff | 0xa0000;
  *(uint *)in_RSI = *(uint *)in_RSI & 0xff0fffff | 0xa00000;
  *(uint *)in_RSI = *(uint *)in_RSI & 0xdfffffff;
  *(uint *)in_RSI = *(uint *)in_RSI & 0xe0ffffff | 0x15000000;
  *(uint *)in_RSI = *(uint *)in_RSI & 0xbfffffff;
  *(uint *)in_RSI = *(uint *)in_RSI & 0x7fffffff | 0x80000000;
  in_RSI[1] = (QDataStream)0xaa;
  *in_RSI = (QDataStream)0xaa;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QSizePolicy &policy)
{
    quint32 data;
    stream >> data;
    policy.bits.horPolicy =  VALUE_OF_BITS(data, 0, 4);
    policy.bits.verPolicy =  VALUE_OF_BITS(data, 4, 4);
    policy.bits.hfw =        VALUE_OF_BITS(data, 8, 1);
    policy.bits.ctype =      VALUE_OF_BITS(data, 9, 5);
    policy.bits.wfh =        VALUE_OF_BITS(data, 14, 1);
    policy.bits.retainSizeWhenHidden =    VALUE_OF_BITS(data, 15, 1);
    policy.bits.verStretch = VALUE_OF_BITS(data, 16, 8);
    policy.bits.horStretch = VALUE_OF_BITS(data, 24, 8);
    return stream;
}